

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::RandomOrderTexImageCubeCase::createTexture
          (RandomOrderTexImageCubeCase *this)

{
  CubeFace CVar1;
  deUint32 format;
  deUint32 type;
  float height;
  float width;
  int iVar2;
  int y;
  deUint32 dVar3;
  char *str;
  reference pvVar4;
  iterator first;
  iterator last;
  size_type sVar5;
  void *data;
  int local_184;
  PixelBufferAccess local_178;
  PixelBufferAccess local_150;
  Vector<float,_4> local_124;
  Vector<float,_4> local_114;
  undefined1 local_104 [8];
  Vec4 gMax;
  Vector<float,_4> local_e4;
  undefined1 local_d4 [8];
  Vec4 gMin;
  int levelH;
  int levelW;
  CubeFace face_1;
  int levelNdx;
  int ndx_1;
  CubeFace local_a0;
  pair<int,_tcu::CubeFace> local_9c;
  CubeFace local_94;
  int local_90;
  int face;
  int ndx;
  vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> images;
  undefined1 local_60 [8];
  Random rnd;
  TextureLevel levelData;
  deUint32 tex;
  int numLevels;
  TextureFormat fmt;
  RandomOrderTexImageCubeCase *this_local;
  
  _tex = (this->super_TextureSpecCase).m_texFormat;
  fmt = (TextureFormat)this;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_184 = 1;
  }
  else {
    iVar2 = ::deLog2Floor32((this->super_TextureSpecCase).m_width);
    y = ::deLog2Floor32((this->super_TextureSpecCase).m_height);
    local_184 = de::max<int>(iVar2,y);
    local_184 = local_184 + 1;
  }
  levelData.m_data.m_cap._4_4_ = local_184;
  levelData.m_data.m_cap._0_4_ = 0;
  tcu::TextureLevel::TextureLevel((TextureLevel *)&rnd.m_rnd.z,(TextureFormat *)&tex);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)local_60,dVar3);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureSpecCase).super_ContextWrapper,1,
             (deUint32 *)&levelData.m_data.m_cap);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureSpecCase).super_ContextWrapper,0x8513,
             (deUint32)levelData.m_data.m_cap);
  sglr::ContextWrapper::glPixelStorei(&(this->super_TextureSpecCase).super_ContextWrapper,0xcf5,1);
  iVar2 = levelData.m_data.m_cap._4_4_ * 6;
  std::allocator<std::pair<int,_tcu::CubeFace>_>::allocator
            ((allocator<std::pair<int,_tcu::CubeFace>_> *)((long)&face + 3));
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  vector((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> *)
         &ndx,(long)iVar2,(allocator<std::pair<int,_tcu::CubeFace>_> *)((long)&face + 3));
  std::allocator<std::pair<int,_tcu::CubeFace>_>::~allocator
            ((allocator<std::pair<int,_tcu::CubeFace>_> *)((long)&face + 3));
  for (local_90 = 0; local_90 < levelData.m_data.m_cap._4_4_; local_90 = local_90 + 1) {
    for (local_94 = CUBEFACE_NEGATIVE_X; (int)local_94 < 6;
        local_94 = local_94 + CUBEFACE_POSITIVE_X) {
      local_a0 = local_94;
      local_9c = std::make_pair<int&,tcu::CubeFace>(&local_90,&local_a0);
      pvVar4 = std::
               vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
               ::operator[]((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                             *)&ndx,(long)(int)(local_90 * 6 + local_94));
      std::pair<int,_tcu::CubeFace>::operator=(pvVar4,&local_9c);
    }
  }
  first = std::
          vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
          begin((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                 *)&ndx);
  last = std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
         ::end((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                *)&ndx);
  de::Random::
  shuffle<__gnu_cxx::__normal_iterator<std::pair<int,tcu::CubeFace>*,std::vector<std::pair<int,tcu::CubeFace>,std::allocator<std::pair<int,tcu::CubeFace>>>>>
            ((Random *)local_60,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<int,_tcu::CubeFace>_*,_std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>_>
              )last._M_current);
  face_1 = CUBEFACE_NEGATIVE_X;
  while( true ) {
    sVar5 = std::
            vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
            size((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                  *)&ndx);
    if ((int)sVar5 <= (int)face_1) break;
    pvVar4 = std::
             vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
             ::operator[]((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                           *)&ndx,(long)(int)face_1);
    iVar2 = pvVar4->first;
    pvVar4 = std::
             vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
             ::operator[]((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>
                           *)&ndx,(long)(int)face_1);
    CVar1 = pvVar4->second;
    levelW._0_1_ = (byte)iVar2;
    gMin.m_data[3] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_width >> ((byte)levelW & 0x1f));
    gMin.m_data[2] =
         (float)de::max<int>(1,(this->super_TextureSpecCase).m_height >> ((byte)levelW & 0x1f));
    tcu::Vector<float,_4>::Vector(&local_e4,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),1.0);
    randomVector<4>((Functional *)local_d4,(Random *)local_60,&local_e4,
                    (Vector<float,_4> *)(gMax.m_data + 2));
    tcu::Vector<float,_4>::Vector(&local_114,0.0);
    tcu::Vector<float,_4>::Vector(&local_124,1.0);
    randomVector<4>((Functional *)local_104,(Random *)local_60,&local_114,&local_124);
    tcu::TextureLevel::setSize
              ((TextureLevel *)&rnd.m_rnd.z,(int)gMin.m_data[3],(int)gMin.m_data[2],1);
    tcu::TextureLevel::getAccess(&local_150,(TextureLevel *)&rnd.m_rnd.z);
    tcu::fillWithComponentGradients(&local_150,(Vec4 *)local_d4,(Vec4 *)local_104);
    width = gMin.m_data[3];
    height = gMin.m_data[2];
    dVar3 = *(deUint32 *)(s_cubeMapFaces + (ulong)CVar1 * 4);
    format = this->m_format;
    type = this->m_dataType;
    tcu::TextureLevel::getAccess(&local_178,(TextureLevel *)&rnd.m_rnd.z);
    data = tcu::PixelBufferAccess::getDataPtr(&local_178);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_TextureSpecCase).super_ContextWrapper,dVar3,iVar2,format,(int)width,
               (int)height,0,format,type,data);
    face_1 = face_1 + CUBEFACE_POSITIVE_X;
  }
  std::vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_>::
  ~vector((vector<std::pair<int,_tcu::CubeFace>,_std::allocator<std::pair<int,_tcu::CubeFace>_>_> *)
          &ndx);
  de::Random::~Random((Random *)local_60);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&rnd.m_rnd.z);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// Level-face pairs.
		vector<pair<int, tcu::CubeFace> >	images	(numLevels*6);

		for (int ndx = 0; ndx < numLevels; ndx++)
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				images[ndx*6 + face] = std::make_pair(ndx, (tcu::CubeFace)face);

		rnd.shuffle(images.begin(), images.end());

		for (int ndx = 0; ndx < (int)images.size(); ndx++)
		{
			int				levelNdx	= images[ndx].first;
			tcu::CubeFace	face		= images[ndx].second;
			int				levelW		= de::max(1, m_width >> levelNdx);
			int				levelH		= de::max(1, m_height >> levelNdx);
			Vec4			gMin		= randomVector<4>(rnd);
			Vec4			gMax		= randomVector<4>(rnd);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(s_cubeMapFaces[face], levelNdx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}